

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void sort_quests(int32 **qarr,int32 *nqfone,uint32 nfone,int32 *nquests)

{
  void *ptr;
  void *ptr_00;
  int32 *flag;
  int32 *marker;
  int local_30;
  int32 k;
  int32 j;
  int32 i;
  int32 *nquests_local;
  uint32 nfone_local;
  int32 *nqfone_local;
  int32 **qarr_local;
  
  ptr = __ckd_calloc__((long)*nquests,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x2d1);
  for (k = 0; local_30 = k, k < *nquests; k = k + 1) {
    while (local_30 = local_30 + 1, local_30 < *nquests) {
      if (nqfone[k] + nqfone[local_30] == nfone) {
        ptr_00 = __ckd_calloc__((ulong)nfone,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x2d6);
        for (marker._4_4_ = 0; (int)marker._4_4_ < nqfone[k]; marker._4_4_ = marker._4_4_ + 1) {
          *(undefined4 *)((long)ptr_00 + (long)qarr[k][(int)marker._4_4_] * 4) = 1;
        }
        for (marker._4_4_ = 0; (int)marker._4_4_ < nqfone[local_30]; marker._4_4_ = marker._4_4_ + 1
            ) {
          *(undefined4 *)((long)ptr_00 + (long)qarr[local_30][(int)marker._4_4_] * 4) = 1;
        }
        marker._4_4_ = 0;
        while ((marker._4_4_ < nfone && (*(int *)((long)ptr_00 + (long)(int)marker._4_4_ * 4) != 0))
              ) {
          marker._4_4_ = marker._4_4_ + 1;
        }
        if (marker._4_4_ == nfone) {
          if (nqfone[local_30] < nqfone[k]) {
            *(undefined4 *)((long)ptr + (long)k * 4) = 1;
          }
          else {
            *(undefined4 *)((long)ptr + (long)local_30 * 4) = 1;
          }
        }
        ckd_free(ptr_00);
      }
    }
  }
  local_30 = 0;
  for (k = 0; k < *nquests; k = k + 1) {
    if (*(int *)((long)ptr + (long)k * 4) == 1) {
      ckd_free(qarr[k]);
    }
    else {
      qarr[local_30] = qarr[k];
      nqfone[local_30] = nqfone[k];
      local_30 = local_30 + 1;
    }
  }
  *nquests = local_30;
  ckd_free(ptr);
  return;
}

Assistant:

void   sort_quests(int32 **qarr, int32 *nqfone, uint32 nfone, int32 *nquests)
{
    int32  i, j, k;
    int32  *marker, *flag;

    marker = (int32 *) ckd_calloc(*nquests,sizeof(int32));

    for (i=0;i<*nquests;i++){
        for (j=i+1; j < *nquests; j++){
            if (nqfone[i]+nqfone[j] != nfone) continue;
            flag = (int32 *) ckd_calloc(nfone,sizeof(int32));
            for (k=0;k < nqfone[i];k++) flag[qarr[i][k]] = 1;
            for (k=0;k < nqfone[j];k++) flag[qarr[j][k]] = 1;
            for (k=0;k < nfone;k++) if (flag[k] == 0) break;
            if (k == nfone) { /* the two questions are complements */
                if (nqfone[i] > nqfone[j]) marker [i] = 1;
                else marker[j] = 1;
            }
            ckd_free((void *)flag);
        }
    }
    for (i=0,j=0;i<*nquests;i++){
        if (marker[i] == 1) {
            ckd_free((void *)qarr[i]);
            continue;
        }
        qarr[j] = qarr[i];
        nqfone[j] = nqfone[i];
        j++;
    }
    *nquests = j;
       
    ckd_free((void *) marker);
}